

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeThreadData.cpp
# Opt level: O1

DWORD __thiscall RuntimeThreadData::ThreadProc(RuntimeThreadData *this)

{
  bool bVar1;
  JsErrorCode jsErrorCode;
  DWORD DVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  DWORD_PTR DVar5;
  char16_t *format;
  long in_FS_OFFSET;
  JsValueRef local_70;
  JsValueRef fname;
  JsValueRef args [3];
  JsValueRef scriptSource;
  HANDLE handles [2];
  
  *(RuntimeThreadData **)(in_FS_OFFSET + -0x18) = this;
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateRuntime)
                          (JsRuntimeAttributeNone,(JsThreadServiceCallback)0x0,&this->runtime);
  if (jsErrorCode == JsNoError) {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)
                            (this->runtime,&this->context);
    if (jsErrorCode == JsNoError) {
      jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(this->context);
      if (jsErrorCode == JsNoError) {
        bVar1 = WScriptJsrt::Initialize();
        if (!bVar1) goto LAB_0011523b;
        jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                                ((this->initialSource)._M_dataplus._M_p,
                                 (uint)(this->initialSource)._M_string_length,
                                 (JsFinalizeCallback)0x0,(void *)0x0,args + 2);
        if (jsErrorCode == JsNoError) {
          (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("agent source",0xc,&local_70);
          DVar5 = WScriptJsrt::GetNextSourceContext();
          (*ChakraRTInterface::m_jsApiHooks.pfJsrtRun)
                    (args[2],DVar5,local_70,JsParseScriptAttributeNone,(JsValueRef *)0x0);
          SetEvent(this->parent->hevntInitialScriptCompleted);
          do {
            scriptSource = this->hevntReceivedBroadcast;
            handles[0] = this->hevntShutdown;
            DVar2 = WaitForMultipleObjects(2,&scriptSource,0,0xffffffff);
            if (DVar2 == 0) {
              (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)(&fname);
              (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateSharedArrayBufferWithSharedContent)
                        (this->parent->sharedContent,args);
              (*ChakraRTInterface::m_jsApiHooks.pfJsrtDoubleToNumber)(1.0,args + 1);
              ReleaseSemaphore(this->parent->hSemaphore,1,(LPLONG)0x0);
              if (this->receiveBroadcastCallbackFunc != (JsValueRef)0x0) {
                (*ChakraRTInterface::m_jsApiHooks.pfJsrtCallFunction)
                          (this->receiveBroadcastCallbackFunc,&fname,3,(JsValueRef *)0x0);
              }
            }
            else if (DVar2 == 1) goto LAB_0011539d;
            if (this->leaving == true) goto LAB_0011539d;
          } while (DVar2 == 0);
          ThreadProc();
LAB_0011539d:
          WScriptJsrt::Uninitialize();
          if (this->receiveBroadcastCallbackFunc != (JsRef)0x0) {
            (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)
                      (this->receiveBroadcastCallbackFunc,(uint *)0x0);
          }
          goto LAB_0011523b;
        }
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)this->initialSource.c_str(), (unsigned int)this->initialSource.size(), nullptr, nullptr, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
      else {
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
        format = 
        L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n";
      }
    }
    else {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
      format = 
      L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    pWVar4 = Helpers::JsErrorCodeToString(jsErrorCode);
    format = 
    L"ERROR: ChakraRTInterface::JsCreateRuntime(JsRuntimeAttributeNone, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
    ;
  }
  PAL_fwprintf(pPVar3,format,(ulong)jsErrorCode,pWVar4);
  pPVar3 = PAL_get_stderr(0);
  PAL_fflush(pPVar3);
LAB_0011523b:
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)((JsContextRef)0x0);
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtDisposeRuntime)(this->runtime);
  return 0;
}

Assistant:

DWORD RuntimeThreadData::ThreadProc()
{
    JsValueRef scriptSource;
    JsValueRef fname;
    const char* fullPath = "agent source";
    HRESULT hr = S_OK;

    threadLocalData.Initialize(this);

    IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(JsRuntimeAttributeNone, nullptr, &runtime));
    IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
    IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));


    if (!WScriptJsrt::Initialize())
    {
        IfFailGo(E_FAIL);
    }


    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)this->initialSource.c_str(),
        (unsigned int)this->initialSource.size(), nullptr, nullptr, &scriptSource));


    ChakraRTInterface::JsCreateString(fullPath, strlen(fullPath), &fname);

    ChakraRTInterface::JsRun(scriptSource, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr);

    SetEvent(this->parent->hevntInitialScriptCompleted);

    // loop waiting for work;

    while (true)
    {
        HANDLE handles[] = { this->hevntReceivedBroadcast, this->hevntShutdown };
        DWORD waitRet = WaitForMultipleObjects(_countof(handles), handles, false, INFINITE);

        if (waitRet == WAIT_OBJECT_0)
        {
            JsValueRef args[3];
            ChakraRTInterface::JsGetGlobalObject(&args[0]);
            ChakraRTInterface::JsCreateSharedArrayBufferWithSharedContent(this->parent->sharedContent, &args[1]);
            ChakraRTInterface::JsDoubleToNumber(1, &args[2]);

            // notify the parent we received the data
            ReleaseSemaphore(this->parent->hSemaphore, 1, NULL);

            if (this->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsCallFunction(this->receiveBroadcastCallbackFunc, args, 3, nullptr);
            }
        }

        if (waitRet == WAIT_OBJECT_0 + 1 || this->leaving)
        {
            WScriptJsrt::Uninitialize();

            if (this->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsRelease(this->receiveBroadcastCallbackFunc, nullptr);
            }
            ChakraRTInterface::JsSetCurrentContext(nullptr);
            ChakraRTInterface::JsDisposeRuntime(runtime);

            threadLocalData.Uninitialize();
            return 0;
        }
        else if (waitRet != WAIT_OBJECT_0)
        {
            Assert(false);
            break;
        }
    }

Error:

    ChakraRTInterface::JsSetCurrentContext(nullptr);
    ChakraRTInterface::JsDisposeRuntime(runtime);
    threadLocalData.Uninitialize();
    return 0;
}